

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O3

void __thiscall
QGraphicsView::render
          (QGraphicsView *this,QPainter *painter,QRectF *target,QRect *source,
          AspectRatioMode aspectRatioMode)

{
  QGraphicsViewPrivate *this_00;
  Data *pDVar1;
  QWidgetData *pQVar2;
  QGraphicsScene *this_01;
  QGraphicsItemPrivate *this_02;
  bool bVar3;
  bool bVar4;
  qsizetype qVar5;
  char cVar6;
  int iVar7;
  QWidget *pQVar8;
  long *plVar9;
  void *pvVar10;
  QGraphicsItem **ppQVar11;
  QTransform *pQVar12;
  QStyleOptionGraphicsItem *array;
  ulong uVar13;
  Representation RVar14;
  uint numItems;
  long lVar15;
  qint64 qVar16;
  qreal *pqVar17;
  undefined8 *puVar18;
  undefined8 uVar19;
  QRect *pQVar20;
  undefined8 uVar21;
  int iVar22;
  undefined8 uVar23;
  int iVar24;
  QStyleOptionGraphicsItem *option;
  long in_FS_OFFSET;
  byte bVar25;
  double dVar26;
  qreal qVar27;
  qreal qVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  QPainterPath path;
  QTransform painterMatrix;
  QTransform moveMatrix;
  double local_210;
  double local_200;
  QRegion local_190;
  QList<QGraphicsItem_*> local_188;
  QPolygonF local_168;
  double local_148;
  double dStack_140;
  qreal local_138;
  qreal qStack_130;
  QRect local_128;
  undefined4 local_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined2 local_e0;
  QTransform local_d8;
  QRect local_88 [4];
  undefined2 local_40;
  long local_38;
  
  bVar25 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QGraphicsViewPrivate **)(this + 8);
  pDVar1 = (this_00->scene).wp.d;
  if ((((pDVar1 != (Data *)0x0) && (*(int *)(pDVar1 + 4) != 0)) && (painter != (QPainter *)0x0)) &&
     (((this_00->scene).wp.value != (QObject *)0x0 && (cVar6 = QPainter::isActive(), cVar6 != '\0'))
     )) {
    uVar23._0_4_ = source->x1;
    uVar23._4_4_ = source->y1;
    lVar15._0_4_ = source->x2;
    lVar15._4_4_ = source->y2;
    iVar24 = uVar23._4_4_;
    if (lVar15._4_4_ == uVar23._4_4_ + -1 && (undefined4)lVar15 == (undefined4)uVar23 + -1) {
      pQVar8 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
      pQVar2 = pQVar8->data;
      lVar15 = CONCAT44((pQVar2->crect).y2.m_i - (pQVar2->crect).y1.m_i,
                        (pQVar2->crect).x2.m_i - (pQVar2->crect).x1.m_i);
      uVar23 = 0;
      iVar24 = 0;
    }
    local_148 = target->xp;
    dStack_140 = target->yp;
    qVar28 = target->w;
    qVar27 = target->h;
    iVar22 = (int)uVar23;
    if (((target->w == 0.0) && (!NAN(target->w))) && ((target->h == 0.0 && (!NAN(target->h))))) {
      local_138 = qVar28;
      qStack_130 = qVar27;
      plVar9 = (long *)QPainter::device();
      iVar7 = (**(code **)(*plVar9 + 0x10))(plVar9);
      if (iVar7 == 5) {
        local_148 = (double)iVar22;
        dStack_140 = (double)iVar24;
        qVar28 = (qreal)(((long)(int)lVar15 - (long)iVar22) + 1);
        qVar27 = (qreal)(((lVar15 >> 0x20) - (long)iVar24) + 1);
      }
      else {
        plVar9 = (long *)QPainter::device();
        iVar7 = (**(code **)(*plVar9 + 0x20))(plVar9,1);
        qVar28 = (qreal)iVar7;
        plVar9 = (long *)QPainter::device();
        iVar7 = (**(code **)(*plVar9 + 0x20))(plVar9,2);
        qVar27 = (qreal)iVar7;
        local_148 = 0.0;
        dStack_140 = 0.0;
      }
    }
    local_88[0].x2.m_i = (int)lVar15 + 1;
    RVar14.m_i = (int)((ulong)lVar15 >> 0x20) + 1;
    dVar29 = qVar28 / (double)(local_88[0].x2.m_i - iVar22);
    dVar26 = qVar27 / (double)(RVar14.m_i - iVar24);
    local_210 = dVar29;
    local_200 = dVar26;
    if (aspectRatioMode == KeepAspectRatioByExpanding) {
      local_210 = dVar26;
      if (dVar26 <= dVar29) {
        local_210 = dVar29;
        local_200 = dVar29;
      }
    }
    else if ((aspectRatioMode == KeepAspectRatio) && (local_200 = dVar29, dVar26 <= dVar29)) {
      local_210 = dVar26;
      local_200 = dVar26;
    }
    local_168.super_QList<QPointF>.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_168.super_QList<QPointF>.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_168.super_QList<QPointF>.d.ptr = (QPointF *)&DAT_aaaaaaaaaaaaaaaa;
    local_88[0].x1.m_i = iVar22 + -1;
    local_88[0].y1.m_i = iVar24 + -1;
    local_88[0].y2.m_i = RVar14.m_i;
    local_138 = qVar28;
    qStack_130 = qVar27;
    mapToScene(&local_168,this,local_88);
    local_188.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_188.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_188.d.ptr = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
    this_01 = (QGraphicsScene *)(this_00->scene).wp.value;
    puVar18 = &DAT_006f5bc8;
    pQVar20 = local_88;
    for (lVar15 = 9; lVar15 != 0; lVar15 = lVar15 + -1) {
      uVar23 = *puVar18;
      pQVar20->x1 = (Representation)(int)uVar23;
      pQVar20->y1 = (Representation)(int)((ulong)uVar23 >> 0x20);
      puVar18 = puVar18 + (ulong)bVar25 * -2 + 1;
      pQVar20 = (QRect *)&pQVar20[-(ulong)bVar25].x2;
    }
    local_40 = 0;
    QGraphicsScene::items
              (&local_188,this_01,&local_168,IntersectsItemBoundingRect,DescendingOrder,
               (QTransform *)local_88);
    qVar5 = local_188.d.size;
    pvVar10 = operator_new__(local_188.d.size * 8);
    numItems = (uint)qVar5;
    if (0 < (int)numItems) {
      uVar13 = (ulong)(numItems & 0x7fffffff);
      ppQVar11 = local_188.d.ptr;
      do {
        *(QGraphicsItem **)((long)pvVar10 + uVar13 * 8 + -8) = *ppQVar11;
        ppQVar11 = ppQVar11 + 1;
        uVar13 = uVar13 - 1;
      } while (uVar13 != 0);
    }
    QList<QGraphicsItem_*>::clear(&local_188);
    puVar18 = &DAT_006f5c10;
    pQVar20 = local_88;
    for (lVar15 = 10; lVar15 != 0; lVar15 = lVar15 + -1) {
      uVar23 = *puVar18;
      pQVar20->x1 = (Representation)(int)uVar23;
      pQVar20->y1 = (Representation)(int)((ulong)uVar23 >> 0x20);
      puVar18 = puVar18 + (ulong)bVar25 * -2 + 1;
      pQVar20 = (QRect *)&pQVar20[-(ulong)bVar25].x2;
    }
    if ((this_00->field_0x300 & 0x20) == 0) {
      qVar16 = this_00->scrollX;
    }
    else {
      QGraphicsViewPrivate::updateScroll(this_00);
      qVar16 = this_00->scrollX;
      if ((this_00->field_0x300 & 0x20) != 0) {
        QGraphicsViewPrivate::updateScroll(this_00);
      }
    }
    QTransform::fromTranslate((double)-qVar16,(double)-this_00->scrollY);
    pqVar17 = (qreal *)&DAT_006f5c10;
    pQVar12 = &local_d8;
    for (lVar15 = 10; lVar15 != 0; lVar15 = lVar15 + -1) {
      pQVar12->m_matrix[0][0] = *pqVar17;
      pqVar17 = pqVar17 + (ulong)bVar25 * -2 + 1;
      pQVar12 = (QTransform *)((long)pQVar12 + ((ulong)bVar25 * -2 + 1) * 8);
    }
    QTransform::operator*(&local_d8,&this_00->matrix);
    dVar29 = dStack_140;
    dVar26 = local_148;
    puVar18 = &DAT_006f5bc8;
    pQVar20 = &local_128;
    for (lVar15 = 9; lVar15 != 0; lVar15 = lVar15 + -1) {
      uVar23 = *puVar18;
      pQVar20->x1 = (Representation)(int)uVar23;
      pQVar20->y1 = (Representation)(int)((ulong)uVar23 >> 0x20);
      puVar18 = puVar18 + (ulong)bVar25 * -2 + 1;
      pQVar20 = (QRect *)&pQVar20[-(ulong)bVar25].x2;
    }
    local_e0 = 0;
    QTransform::translate(local_148,dStack_140);
    QTransform::scale(local_210,local_200);
    pQVar12 = (QTransform *)QTransform::translate((double)-iVar22,(double)-iVar24);
    QTransform::operator*=(&local_d8,pQVar12);
    array = QGraphicsViewPrivate::allocStyleOptionsArray(this_00,numItems);
    if (0 < (int)numItems) {
      dVar30 = (double)((ulong)dVar26 & 0x8000000000000000 | 0x3fe0000000000000) + dVar26;
      bVar3 = 2147483647.0 < dVar30;
      if (dVar30 <= -2147483648.0) {
        dVar30 = -2147483648.0;
      }
      dVar30 = (double)(-(ulong)bVar3 & 0x41dfffffffc00000 | ~-(ulong)bVar3 & (ulong)dVar30);
      uVar19._0_4_ = (int)dVar30;
      dVar31 = (double)((ulong)dVar29 & 0x8000000000000000 | 0x3fe0000000000000) + dVar29;
      bVar3 = 2147483647.0 < dVar31;
      if (dVar31 <= -2147483648.0) {
        dVar31 = -2147483648.0;
      }
      dVar31 = (double)(-(ulong)bVar3 & 0x41dfffffffc00000 | ~-(ulong)bVar3 & (ulong)dVar31);
      RVar14.m_i = (int)dVar31;
      dVar26 = qVar28 + (dVar26 - (double)(int)dVar30) * 0.5;
      dVar26 = (double)((ulong)dVar26 & 0x8000000000000000 | 0x3fe0000000000000) + dVar26;
      bVar3 = 2147483647.0 < dVar26;
      if (dVar26 <= -2147483648.0) {
        dVar26 = -2147483648.0;
      }
      dVar29 = qVar27 + (dVar29 - (double)(int)dVar31) * 0.5;
      dVar29 = (double)((ulong)dVar29 & 0x8000000000000000 | 0x3fe0000000000000) + dVar29;
      bVar4 = 2147483647.0 < dVar29;
      if (dVar29 <= -2147483648.0) {
        dVar29 = -2147483648.0;
      }
      uVar21._0_4_ = uVar19._0_4_ +
                     (int)(double)(-(ulong)bVar3 & 0x41dfffffffc00000 |
                                  ~-(ulong)bVar3 & (ulong)dVar26) + -1;
      uVar19._4_4_ = RVar14.m_i;
      uVar21._4_4_ = RVar14.m_i +
                     (int)(double)(-(ulong)bVar4 & 0x41dfffffffc00000 |
                                  ~-(ulong)bVar4 & (ulong)dVar29) + -1;
      uVar13 = 0;
      option = array;
      do {
        this_02 = *(QGraphicsItemPrivate **)(*(long *)((long)pvVar10 + uVar13 * 8) + 8);
        local_128._0_8_ = uVar19;
        local_128._8_8_ = uVar21;
        QRegion::QRegion(&local_190,&local_128,Rectangle);
        QGraphicsItemPrivate::initStyleOption(this_02,option,&local_d8,&local_190,false);
        QRegion::~QRegion(&local_190);
        uVar13 = uVar13 + 1;
        option = option + 1;
      } while ((numItems & 0x7fffffff) != uVar13);
    }
    QPainter::save();
    QPainter::setClipRect((QRectF *)painter,(ClipOperation)&local_148);
    local_190.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
    QPainterPath::QPainterPath((QPainterPath *)&local_190);
    QPainterPath::addPolygon((QPolygonF *)&local_190);
    QPainterPath::closeSubpath();
    QTransform::map((QPainterPath *)&local_128);
    QPainter::setClipPath((QPainterPath *)painter,(ClipOperation)&local_128);
    QPainterPath::~QPainterPath((QPainterPath *)&local_128);
    QPainter::setTransform((QTransform *)painter,SUB81(&local_d8,0));
    local_118 = 0xffffffff;
    uStack_114 = 0xffffffff;
    uStack_110 = 0xffffffff;
    uStack_10c = 0xffffffff;
    local_128.x1.m_i = -1;
    local_128.y1.m_i = -1;
    local_128.x2.m_i = -1;
    local_128.y2.m_i = -1;
    QPolygonF::boundingRect();
    (**(code **)(*(long *)this + 0x1c8))(this,painter,&local_128);
    (**(code **)(*(long *)this + 0x1d8))(this,painter,qVar5,pvVar10,array);
    (**(code **)(*(long *)this + 0x1d0))(this,painter,&local_128);
    operator_delete__(pvVar10);
    QGraphicsViewPrivate::freeStyleOptionsArray(this_00,array);
    QPainter::restore();
    QPainterPath::~QPainterPath((QPainterPath *)&local_190);
    if (&(local_188.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_188.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_188.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_188.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_188.d.d)->super_QArrayData,8,0x10);
      }
    }
    if (&(local_168.super_QList<QPointF>.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_168.super_QList<QPointF>.d.d)->super_QArrayData).ref_._q_value.
      super___atomic_base<int>._M_i =
           ((local_168.super_QList<QPointF>.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_168.super_QList<QPointF>.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_168.super_QList<QPointF>.d.d)->super_QArrayData,0x10,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsView::render(QPainter *painter, const QRectF &target, const QRect &source,
                           Qt::AspectRatioMode aspectRatioMode)
{
    // ### Switch to using the recursive rendering algorithm instead.

    Q_D(QGraphicsView);
    if (!d->scene || !(painter && painter->isActive()))
        return;

    // Default source rect = viewport rect
    QRect sourceRect = source;
    if (source.isNull())
        sourceRect = viewport()->rect();

    // Default target rect = device rect
    QRectF targetRect = target;
    if (target.isNull()) {
        if (painter->device()->devType() == QInternal::Picture)
            targetRect = sourceRect;
        else
            targetRect.setRect(0, 0, painter->device()->width(), painter->device()->height());
    }

    // Find the ideal x / y scaling ratio to fit \a source into \a target.
    qreal xratio = targetRect.width() / sourceRect.width();
    qreal yratio = targetRect.height() / sourceRect.height();

    // Scale according to the aspect ratio mode.
    switch (aspectRatioMode) {
    case Qt::KeepAspectRatio:
        xratio = yratio = qMin(xratio, yratio);
        break;
    case Qt::KeepAspectRatioByExpanding:
        xratio = yratio = qMax(xratio, yratio);
        break;
    case Qt::IgnoreAspectRatio:
        break;
    }

    // Find all items to draw, and reverse the list (we want to draw
    // in reverse order).
    QPolygonF sourceScenePoly = mapToScene(sourceRect.adjusted(-1, -1, 1, 1));
    QList<QGraphicsItem *> itemList = d->scene->items(sourceScenePoly,
                                                      Qt::IntersectsItemBoundingRect);
    QGraphicsItem **itemArray = new QGraphicsItem *[itemList.size()];
    int numItems = itemList.size();
    for (int i = 0; i < numItems; ++i)
        itemArray[numItems - i - 1] = itemList.at(i);
    itemList.clear();

    // Setup painter matrix.
    QTransform moveMatrix = QTransform::fromTranslate(-d->horizontalScroll(), -d->verticalScroll());
    QTransform painterMatrix = d->matrix * moveMatrix;
    painterMatrix *= QTransform()
                     .translate(targetRect.left(), targetRect.top())
                     .scale(xratio, yratio)
                     .translate(-sourceRect.left(), -sourceRect.top());

    // Generate the style options
    QStyleOptionGraphicsItem *styleOptionArray = d->allocStyleOptionsArray(numItems);
    for (int i = 0; i < numItems; ++i)
        itemArray[i]->d_ptr->initStyleOption(&styleOptionArray[i], painterMatrix, targetRect.toRect());

    painter->save();

    // Clip in device coordinates to avoid QRegion transformations.
    painter->setClipRect(targetRect);
    QPainterPath path;
    path.addPolygon(sourceScenePoly);
    path.closeSubpath();
    painter->setClipPath(painterMatrix.map(path), Qt::IntersectClip);

    // Transform the painter.
    painter->setTransform(painterMatrix, true);

    // Render the scene.
    QRectF sourceSceneRect = sourceScenePoly.boundingRect();
    drawBackground(painter, sourceSceneRect);
    drawItems(painter, numItems, itemArray, styleOptionArray);
    drawForeground(painter, sourceSceneRect);

    delete [] itemArray;
    d->freeStyleOptionsArray(styleOptionArray);

    painter->restore();
}